

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::avx::SphereMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  Scene *pSVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  ulong uVar7;
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar37;
  float fVar38;
  undefined1 auVar32 [16];
  float fVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_1fc;
  RTCFilterFunctionNArguments local_1f8;
  undefined8 local_1c8;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 auStack_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar55 [64];
  
  pSVar3 = context->scene;
  pGVar4 = (pSVar3->geometries).items[sphere->sharedGeomID].ptr;
  lVar20 = *(long *)&pGVar4->field_0x58;
  _Var5 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar27 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[0] * _Var5);
  auVar29 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[1] * _Var5);
  auVar48 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[2] * _Var5);
  auVar2 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[3] * _Var5);
  auVar40 = vunpcklps_avx(auVar27,auVar48);
  auVar27 = vunpckhps_avx(auVar27,auVar48);
  auVar48 = vunpcklps_avx(auVar29,auVar2);
  auVar29 = vunpckhps_avx(auVar29,auVar2);
  auVar2 = vunpcklps_avx(auVar40,auVar48);
  auVar48 = vunpckhps_avx(auVar40,auVar48);
  auVar24 = vunpcklps_avx(auVar27,auVar29);
  auVar33 = vunpckhps_avx(auVar27,auVar29);
  auVar27 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar29 = vpcmpgtd_avx(auVar27,_DAT_01ff0cf0);
  local_d8 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar2 = vsubps_avx(auVar2,auVar45);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40 = vsubps_avx(auVar48,auVar40);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar24 = vsubps_avx(auVar24,auVar27);
  local_1c8._0_4_ = *(float *)(ray + k * 4 + 0x40);
  fVar56 = *(float *)(ray + k * 4 + 0x50);
  local_1b8 = *(float *)(ray + k * 4 + 0x60);
  auVar27 = ZEXT416((uint)((float)local_1c8 * (float)local_1c8 +
                          fVar56 * fVar56 + local_1b8 * local_1b8));
  auVar48 = vshufps_avx(auVar27,auVar27,0);
  auVar27 = vrcpps_avx(auVar48);
  fVar31 = auVar27._0_4_;
  auVar32._0_4_ = fVar31 * auVar48._0_4_;
  fVar37 = auVar27._4_4_;
  auVar32._4_4_ = fVar37 * auVar48._4_4_;
  fVar38 = auVar27._8_4_;
  auVar32._8_4_ = fVar38 * auVar48._8_4_;
  fVar39 = auVar27._12_4_;
  auVar32._12_4_ = fVar39 * auVar48._12_4_;
  auVar48._8_4_ = 0x3f800000;
  auVar48._0_8_ = &DAT_3f8000003f800000;
  auVar48._12_4_ = 0x3f800000;
  auVar27 = vsubps_avx(auVar48,auVar32);
  fVar31 = fVar31 + fVar31 * auVar27._0_4_;
  fVar37 = fVar37 + fVar37 * auVar27._4_4_;
  fVar38 = fVar38 + fVar38 * auVar27._8_4_;
  fVar39 = fVar39 + fVar39 * auVar27._12_4_;
  auVar41._0_4_ =
       ((float)local_1c8 * auVar2._0_4_ + fVar56 * auVar40._0_4_ + local_1b8 * auVar24._0_4_) *
       fVar31;
  auVar41._4_4_ =
       ((float)local_1c8 * auVar2._4_4_ + fVar56 * auVar40._4_4_ + local_1b8 * auVar24._4_4_) *
       fVar37;
  auVar41._8_4_ =
       ((float)local_1c8 * auVar2._8_4_ + fVar56 * auVar40._8_4_ + local_1b8 * auVar24._8_4_) *
       fVar38;
  auVar41._12_4_ =
       ((float)local_1c8 * auVar2._12_4_ + fVar56 * auVar40._12_4_ + local_1b8 * auVar24._12_4_) *
       fVar39;
  auVar49._0_4_ = (float)local_1c8 * auVar41._0_4_;
  auVar49._4_4_ = (float)local_1c8 * auVar41._4_4_;
  auVar49._8_4_ = (float)local_1c8 * auVar41._8_4_;
  auVar49._12_4_ = (float)local_1c8 * auVar41._12_4_;
  auVar51._0_4_ = fVar56 * auVar41._0_4_;
  auVar51._4_4_ = fVar56 * auVar41._4_4_;
  auVar51._8_4_ = fVar56 * auVar41._8_4_;
  auVar51._12_4_ = fVar56 * auVar41._12_4_;
  auVar53._0_4_ = local_1b8 * auVar41._0_4_;
  auVar53._4_4_ = local_1b8 * auVar41._4_4_;
  auVar53._8_4_ = local_1b8 * auVar41._8_4_;
  auVar53._12_4_ = local_1b8 * auVar41._12_4_;
  auVar48 = vsubps_avx(auVar2,auVar49);
  auVar50 = ZEXT1664(auVar48);
  auVar2 = vsubps_avx(auVar40,auVar51);
  auVar47 = ZEXT1664(auVar2);
  auVar40 = vsubps_avx(auVar24,auVar53);
  auVar52 = ZEXT1664(auVar40);
  auVar44._0_4_ =
       auVar48._0_4_ * auVar48._0_4_ + auVar2._0_4_ * auVar2._0_4_ + auVar40._0_4_ * auVar40._0_4_;
  auVar44._4_4_ =
       auVar48._4_4_ * auVar48._4_4_ + auVar2._4_4_ * auVar2._4_4_ + auVar40._4_4_ * auVar40._4_4_;
  auVar44._8_4_ =
       auVar48._8_4_ * auVar48._8_4_ + auVar2._8_4_ * auVar2._8_4_ + auVar40._8_4_ * auVar40._8_4_;
  auVar44._12_4_ =
       auVar48._12_4_ * auVar48._12_4_ +
       auVar2._12_4_ * auVar2._12_4_ + auVar40._12_4_ * auVar40._12_4_;
  auVar28._0_4_ = auVar33._0_4_ * auVar33._0_4_;
  auVar28._4_4_ = auVar33._4_4_ * auVar33._4_4_;
  auVar28._8_4_ = auVar33._8_4_ * auVar33._8_4_;
  auVar28._12_4_ = auVar33._12_4_ * auVar33._12_4_;
  auVar27 = vcmpps_avx(auVar44,auVar28,2);
  auVar24 = auVar29 & auVar27;
  if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0') {
    auVar27 = vandps_avx(auVar27,auVar29);
    auVar29 = vsubps_avx(auVar28,auVar44);
    auVar24._0_4_ = fVar31 * auVar29._0_4_;
    auVar24._4_4_ = fVar37 * auVar29._4_4_;
    auVar24._8_4_ = fVar38 * auVar29._8_4_;
    auVar24._12_4_ = fVar39 * auVar29._12_4_;
    auVar28 = vsqrtps_avx(auVar24);
    auVar61 = ZEXT1664(auVar28);
    auVar32 = vsubps_avx(auVar41,auVar28);
    auVar54._0_4_ = auVar28._0_4_ + auVar41._0_4_;
    auVar54._4_4_ = auVar28._4_4_ + auVar41._4_4_;
    auVar54._8_4_ = auVar28._8_4_ + auVar41._8_4_;
    auVar54._12_4_ = auVar28._12_4_ + auVar41._12_4_;
    auVar55 = ZEXT1664(auVar54);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar33._4_4_ = uVar1;
    auVar33._0_4_ = uVar1;
    auVar33._8_4_ = uVar1;
    auVar33._12_4_ = uVar1;
    auVar29 = vcmpps_avx(auVar33,auVar32,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar42._4_4_ = uVar1;
    auVar42._0_4_ = uVar1;
    auVar42._8_4_ = uVar1;
    auVar42._12_4_ = uVar1;
    auVar24 = vcmpps_avx(auVar32,auVar42,2);
    auVar29 = vandps_avx(auVar24,auVar29);
    auVar62 = ZEXT1664(auVar29);
    auVar29 = vandps_avx(auVar29,auVar27);
    auVar24 = vcmpps_avx(auVar33,auVar54,2);
    auVar33 = vcmpps_avx(auVar54,auVar42,2);
    auVar24 = vandps_avx(auVar24,auVar33);
    auVar27 = vandps_avx(auVar24,auVar27);
    auVar63 = ZEXT1664(auVar27);
    auVar27 = vorps_avx(auVar27,auVar29);
    uVar19 = vmovmskps_avx(auVar27);
    if (uVar19 != 0) {
      auVar34._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      auVar34._8_4_ = -auVar28._8_4_;
      auVar34._12_4_ = -auVar28._12_4_;
      local_1a8 = vblendvps_avx(auVar54,auVar32,auVar29);
      auVar27 = vblendvps_avx(auVar28,auVar34,auVar29);
      fVar31 = auVar27._0_4_;
      auVar35._0_4_ = (float)local_1c8 * fVar31;
      fVar37 = auVar27._4_4_;
      auVar35._4_4_ = (float)local_1c8 * fVar37;
      fVar38 = auVar27._8_4_;
      auVar35._8_4_ = (float)local_1c8 * fVar38;
      fVar39 = auVar27._12_4_;
      auVar35._12_4_ = (float)local_1c8 * fVar39;
      auVar43._0_4_ = fVar56 * fVar31;
      auVar43._4_4_ = fVar56 * fVar37;
      auVar43._8_4_ = fVar56 * fVar38;
      auVar43._12_4_ = fVar56 * fVar39;
      auVar29._0_4_ = local_1b8 * fVar31;
      auVar29._4_4_ = local_1b8 * fVar37;
      auVar29._8_4_ = local_1b8 * fVar38;
      auVar29._12_4_ = local_1b8 * fVar39;
      local_198 = vsubps_avx(auVar35,auVar48);
      local_188 = vsubps_avx(auVar43,auVar2);
      local_178 = vsubps_avx(auVar29,auVar40);
      uVar21 = (ulong)(uVar19 & 0xff);
      lVar20 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      local_1c8._4_4_ = (float)local_1c8;
      fVar31 = (float)local_1c8;
      fVar37 = (float)local_1c8;
      fVar38 = fVar56;
      fVar39 = fVar56;
      fVar57 = fVar56;
      fVar58 = local_1b8;
      fVar59 = local_1b8;
      fVar60 = local_1b8;
      do {
        auVar8 = _local_f8;
        local_1f8.valid = (int *)&local_218;
        uVar7 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar19 = *(uint *)(local_d8 + uVar7 * 4);
        pGVar4 = (pSVar3->geometries).items[uVar19].ptr;
        local_1f8.ray = (RTCRayN *)ray;
        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar21 = uVar21 ^ 1L << (uVar7 & 0x3f);
          bVar22 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar22 = false;
        }
        else {
          local_1fc = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar7 * 4);
          local_1f8.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar19),0);
          local_78._4_4_ = (sphere->primIDs).field_0.i[uVar7];
          local_c8._4_4_ = *(undefined4 *)(local_198 + uVar7 * 4);
          uVar1 = *(undefined4 *)(local_188 + uVar7 * 4);
          local_b8._4_4_ = uVar1;
          local_b8._0_4_ = uVar1;
          local_b8._8_4_ = uVar1;
          local_b8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_178 + uVar7 * 4);
          local_a8._4_4_ = uVar1;
          local_a8._0_4_ = uVar1;
          local_a8._8_4_ = uVar1;
          local_a8._12_4_ = uVar1;
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          local_98 = ZEXT432(0) << 0x20;
          local_78._0_4_ = local_78._4_4_;
          local_78._8_4_ = local_78._4_4_;
          local_78._12_4_ = local_78._4_4_;
          vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_54 = (local_1f8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (local_1f8.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_218 = *(undefined8 *)(mm_lookupmask_ps + lVar20);
          uStack_210 = *(undefined8 *)(mm_lookupmask_ps + lVar20 + 8);
          local_1f8.geometryUserPtr = pGVar4->userPtr;
          local_1f8.hit = (RTCHitN *)local_c8;
          local_1f8.N = 4;
          local_f8._4_4_ = fVar38;
          local_f8._0_4_ = fVar56;
          fStack_f0 = fVar39;
          auStack_e8 = auVar8._16_16_;
          fStack_ec = fVar57;
          local_108 = auVar50._0_16_;
          local_118 = auVar47._0_16_;
          local_128 = auVar52._0_16_;
          local_138 = auVar55._0_16_;
          local_148 = auVar61._0_16_;
          local_158 = auVar62._0_16_;
          local_168 = auVar63._0_16_;
          fStack_1c0 = fVar31;
          fStack_1bc = fVar37;
          fStack_1b4 = fVar58;
          fStack_1b0 = fVar59;
          fStack_1ac = fVar60;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&local_1f8);
            auVar63 = ZEXT1664(local_168);
            auVar62 = ZEXT1664(local_158);
            auVar61 = ZEXT1664(local_148);
            auVar55 = ZEXT1664(local_138);
            auVar52 = ZEXT1664(local_128);
            auVar47 = ZEXT1664(local_118);
            auVar50 = ZEXT1664(local_108);
            auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            fVar56 = (float)local_f8._0_4_;
            fVar38 = (float)local_f8._4_4_;
            fVar39 = fStack_f0;
            fVar57 = fStack_ec;
          }
          auVar2._8_8_ = uStack_210;
          auVar2._0_8_ = local_218;
          if (auVar2 == (undefined1  [16])0x0) {
            auVar29 = ZEXT816(0) << 0x40;
            auVar27 = vpcmpeqd_avx((undefined1  [16])0x0,auVar29);
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            auVar27 = auVar27 ^ auVar29;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&local_1f8);
              auVar63 = ZEXT1664(local_168);
              auVar62 = ZEXT1664(local_158);
              auVar61 = ZEXT1664(local_148);
              auVar55 = ZEXT1664(local_138);
              auVar52 = ZEXT1664(local_128);
              auVar47 = ZEXT1664(local_118);
              auVar50 = ZEXT1664(local_108);
              auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              fVar56 = (float)local_f8._0_4_;
              fVar38 = (float)local_f8._4_4_;
              fVar39 = fStack_f0;
              fVar57 = fStack_ec;
            }
            auVar16._8_8_ = uStack_210;
            auVar16._0_8_ = local_218;
            auVar29 = vpcmpeqd_avx((undefined1  [16])0x0,auVar16);
            auVar27 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar27 = auVar29 ^ auVar27;
            auVar29 = vblendvps_avx(auVar46._0_16_,*(undefined1 (*) [16])(local_1f8.ray + 0x80),
                                    auVar29);
            *(undefined1 (*) [16])(local_1f8.ray + 0x80) = auVar29;
          }
          auVar27 = vpslld_avx(auVar27,0x1f);
          bVar13 = (auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar14 = (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar12 = (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar23 = -1 < auVar27[0xf];
          bVar22 = ((bVar13 && bVar14) && bVar12) && bVar23;
          fVar31 = fStack_1c0;
          fVar37 = fStack_1bc;
          fVar58 = fStack_1b4;
          fVar59 = fStack_1b0;
          fVar60 = fStack_1ac;
          if (((bVar13 && bVar14) && bVar12) && bVar23) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_1fc;
            uVar21 = uVar21 ^ 1L << (uVar7 & 0x3f);
          }
        }
      } while ((bVar22 != false) && (uVar21 != 0));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar25._4_4_ = uVar1;
      auVar25._0_4_ = uVar1;
      auVar25._8_4_ = uVar1;
      auVar25._12_4_ = uVar1;
      local_1a8 = auVar55._0_16_;
      auVar27 = vcmpps_avx(local_1a8,auVar25,2);
      auVar27 = vandps_avx(auVar62._0_16_,auVar27);
      auVar27 = vandps_avx(auVar63._0_16_,auVar27);
      uVar19 = vmovmskps_avx(auVar27);
      if (uVar19 == 0) {
        return (bool)(bVar22 ^ 1U);
      }
      fVar9 = auVar61._0_4_;
      auVar26._0_4_ = (float)local_1c8 * fVar9;
      fVar10 = auVar61._4_4_;
      auVar26._4_4_ = local_1c8._4_4_ * fVar10;
      fVar11 = auVar61._8_4_;
      auVar26._8_4_ = fVar31 * fVar11;
      fVar31 = auVar61._12_4_;
      auVar26._12_4_ = fVar37 * fVar31;
      auVar30._0_4_ = fVar56 * fVar9;
      auVar30._4_4_ = fVar38 * fVar10;
      auVar30._8_4_ = fVar39 * fVar11;
      auVar30._12_4_ = fVar57 * fVar31;
      auVar36._0_4_ = local_1b8 * fVar9;
      auVar36._4_4_ = fVar58 * fVar10;
      auVar36._8_4_ = fVar59 * fVar11;
      auVar36._12_4_ = fVar60 * fVar31;
      local_198 = vsubps_avx(auVar26,auVar50._0_16_);
      local_188 = vsubps_avx(auVar30,auVar47._0_16_);
      local_178 = vsubps_avx(auVar36,auVar52._0_16_);
      pSVar3 = context->scene;
      uVar21 = (ulong)(uVar19 & 0xff);
      local_1c8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar27 = ZEXT816(0) << 0x40;
      auVar47 = ZEXT1664(auVar27);
      auVar8 = vcmpps_avx(ZEXT1632(auVar27),ZEXT1632(auVar27),0xf);
      auVar50 = ZEXT3264(auVar8);
      auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar27 = vpcmpeqd_avx(local_1a8,local_1a8);
      auVar55 = ZEXT1664(auVar27);
      do {
        local_1f8.valid = (int *)&local_218;
        uVar7 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar19 = *(uint *)(local_d8 + uVar7 * 4);
        pGVar4 = (pSVar3->geometries).items[uVar19].ptr;
        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar21 = uVar21 ^ 1L << (uVar7 & 0x3f);
          bVar23 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar23 = false;
        }
        else {
          local_1b8 = *(float *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar7 * 4);
          local_1f8.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar19),0);
          uVar19 = (sphere->primIDs).field_0.i[uVar7];
          local_78._4_4_ = uVar19;
          local_78._0_4_ = uVar19;
          local_78._8_4_ = uVar19;
          local_78._12_4_ = uVar19;
          uVar1 = *(undefined4 *)(local_198 + uVar7 * 4);
          local_c8._4_4_ = uVar1;
          local_c8._0_4_ = uVar1;
          local_c8._8_4_ = uVar1;
          local_c8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_188 + uVar7 * 4);
          local_b8._4_4_ = uVar1;
          local_b8._0_4_ = uVar1;
          local_b8._8_4_ = uVar1;
          local_b8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_178 + uVar7 * 4);
          local_a8._4_4_ = uVar1;
          local_a8._0_4_ = uVar1;
          local_a8._8_4_ = uVar1;
          local_a8._12_4_ = uVar1;
          local_98 = auVar47._0_32_;
          uStack_54 = (local_1f8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (local_1f8.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_218 = *local_1c8;
          uStack_210 = local_1c8[1];
          local_1f8.geometryUserPtr = pGVar4->userPtr;
          local_1f8.hit = (RTCHitN *)local_c8;
          local_1f8.N = 4;
          _local_f8 = auVar50._0_32_;
          local_1f8.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar27 = auVar55._0_16_;
            (*pGVar4->occlusionFilterN)(&local_1f8);
            auVar27 = vpcmpeqd_avx(auVar27,auVar27);
            auVar55 = ZEXT1664(auVar27);
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar50 = ZEXT3264(_local_f8);
            auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
          }
          auVar17._8_8_ = uStack_210;
          auVar17._0_8_ = local_218;
          auVar27 = auVar55._0_16_;
          if (auVar17 == (undefined1  [16])0x0) {
            auVar29 = vpcmpeqd_avx(auVar52._0_16_,(undefined1  [16])0x0);
            auVar27 = auVar27 ^ auVar29;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&local_1f8);
              auVar27 = vpcmpeqd_avx(auVar27,auVar27);
              auVar55 = ZEXT1664(auVar27);
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar50 = ZEXT3264(_local_f8);
              auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            }
            auVar18._8_8_ = uStack_210;
            auVar18._0_8_ = local_218;
            auVar29 = vpcmpeqd_avx(auVar52._0_16_,auVar18);
            auVar27 = auVar55._0_16_ ^ auVar29;
            auVar29 = vblendvps_avx(auVar46._0_16_,*(undefined1 (*) [16])(local_1f8.ray + 0x80),
                                    auVar29);
            *(undefined1 (*) [16])(local_1f8.ray + 0x80) = auVar29;
          }
          auVar27 = vpslld_avx(auVar27,0x1f);
          bVar14 = (auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar15 = (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar13 = (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar12 = -1 < auVar27[0xf];
          bVar23 = ((bVar14 && bVar15) && bVar13) && bVar12;
          if (((bVar14 && bVar15) && bVar13) && bVar12) {
            *(float *)(ray + k * 4 + 0x80) = local_1b8;
            uVar21 = uVar21 ^ 1L << (uVar7 & 0x3f);
          }
        }
      } while ((bVar23 != false) && (uVar21 != 0));
      return (bool)(bVar22 ^ 1U | bVar23 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }